

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O1

void __thiscall
kj::_::anon_unknown_13::FatalThrowExpectation::onFatalException
          (FatalThrowExpectation *this,Exception *exception)

{
  size_t sVar1;
  bool bVar2;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 *params_2;
  char *pcVar3;
  ArrayPtr<const_char> *params_2_00;
  StringPtr haystack;
  
  bVar2 = (this->type).ptr.isSet;
  params_2 = (anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 *)0x0;
  if (bVar2 != false) {
    params_2 = &(this->type).ptr.field_1;
  }
  if ((bVar2 == true) && (exception->type != params_2->value)) {
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[30],kj::Exception&,kj::Exception::Type&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x52,ERROR,"\"threw exception of wrong type\", exception, *expectedType",
                 (char (*) [30])"threw exception of wrong type",exception,&params_2->value);
    }
LAB_004ad325:
    _exit(1);
  }
  bVar2 = (this->message).ptr.isSet;
  params_2_00 = (ArrayPtr<const_char> *)0x0;
  if (bVar2 != false) {
    params_2_00 = (ArrayPtr<const_char> *)&(this->message).ptr.field_1;
  }
  if (bVar2 == true) {
    sVar1 = (exception->description).content.size_;
    if (sVar1 == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (exception->description).content.ptr;
    }
    haystack.content.size_ = sVar1 + (sVar1 == 0);
    haystack.content.ptr = pcVar3;
    bVar2 = hasSubstring(haystack,(StringPtr)*params_2_00);
    if (!bVar2) {
      if (Debug::minSeverity < 3) {
        Debug::log<char_const(&)[35],kj::Exception&,kj::StringPtr&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x58,ERROR,
                   "\"threw exception with wrong message\", exception, *expectedSubstring",
                   (char (*) [35])"threw exception with wrong message",exception,
                   (StringPtr *)params_2_00);
      }
      goto LAB_004ad325;
    }
  }
  _exit(0);
}

Assistant:

virtual void onFatalException(Exception&& exception) {
    KJ_IF_MAYBE(expectedType, type) {
      if (exception.getType() != *expectedType) {
        KJ_LOG(ERROR, "threw exception of wrong type", exception, *expectedType);
        _exit(1);
      }
    }
    KJ_IF_MAYBE(expectedSubstring, message) {
      if (!hasSubstring(exception.getDescription(), *expectedSubstring)) {
        KJ_LOG(ERROR, "threw exception with wrong message", exception, *expectedSubstring);
        _exit(1);
      }
    }
    _exit(0);
  }